

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

void writeGlpsolCostRow(FILE *file,HighsLogOptions *log_options,bool raw,bool is_mip,HighsInt row_id
                       ,string *objective_name,double objective_function_value)

{
  char *pcVar1;
  string *this;
  char *pcVar2;
  array<char,_32UL> double_string;
  stringstream ss;
  string local_200;
  double local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1e0 = objective_function_value;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  if (raw) {
    highsDoubleToString((array<char,_32UL> *)&local_200,local_1e0,1e-12);
    pcVar1 = "b ";
    if (is_mip) {
      pcVar1 = "";
    }
    pcVar2 = " 0";
    if (is_mip) {
      pcVar2 = "";
    }
    highsFormatToString_abi_cxx11_
              (&local_1d8,"i %d %s%s%s\n",(ulong)(uint)row_id,pcVar1,&local_200,pcVar2);
    std::operator<<((ostream *)local_1a8,(string *)&local_1d8);
    this = &local_1d8;
  }
  else {
    highsFormatToString_abi_cxx11_(&local_200,"%6d ",(ulong)(uint)row_id);
    std::operator<<((ostream *)local_1a8,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    if (objective_name->_M_string_length < 0xd) {
      highsFormatToString_abi_cxx11_(&local_200,"%-12s ",(objective_name->_M_dataplus)._M_p);
      std::operator<<((ostream *)local_1a8,(string *)&local_200);
    }
    else {
      highsFormatToString_abi_cxx11_(&local_200,"%s\n%20s",(objective_name->_M_dataplus)._M_p,"");
      std::operator<<((ostream *)local_1a8,(string *)&local_200);
    }
    std::__cxx11::string::~string((string *)&local_200);
    if (is_mip) {
      highsFormatToString_abi_cxx11_(&local_200,"   ");
      std::operator<<((ostream *)local_1a8,(string *)&local_200);
    }
    else {
      highsFormatToString_abi_cxx11_(&local_200,"B  ");
      std::operator<<((ostream *)local_1a8,(string *)&local_200);
    }
    std::__cxx11::string::~string((string *)&local_200);
    highsFormatToString_abi_cxx11_(&local_200,"%13.6g %13s %13s \n",local_1e0,"");
    std::operator<<((ostream *)local_1a8,(string *)&local_200);
    this = &local_200;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::stringbuf::str();
  highsFprintfString(file,log_options,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void writeGlpsolCostRow(FILE* file, const HighsLogOptions& log_options,
                        const bool raw, const bool is_mip,
                        const HighsInt row_id, const std::string objective_name,
                        const double objective_function_value) {
  std::stringstream ss;
  ss.str(std::string());
  if (raw) {
    double double_value = objective_function_value;
    auto double_string = highsDoubleToString(
        double_value, kGlpsolSolutionValueToStringTolerance);
    // Last term of 0 for dual should (also) be blank when not MIP
    ss << highsFormatToString("i %d %s%s%s\n", (int)row_id, is_mip ? "" : "b ",
                              double_string.data(), is_mip ? "" : " 0");
  } else {
    ss << highsFormatToString("%6d ", (int)row_id);
    if (objective_name.length() <= 12) {
      ss << highsFormatToString("%-12s ", objective_name.c_str());
    } else {
      ss << highsFormatToString("%s\n%20s", objective_name.c_str(), "");
    }
    if (is_mip) {
      ss << highsFormatToString("   ");
    } else {
      ss << highsFormatToString("B  ");
    }
    ss << highsFormatToString("%13.6g %13s %13s \n", objective_function_value,
                              "", "");
  }
  highsFprintfString(file, log_options, ss.str());
}